

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagStackFrame.cpp
# Opt level: O1

Var * __thiscall
Js::DiagNativeStackFrame::GetSlotOffsetLocation
          (DiagNativeStackFrame *this,RegSlot slotId,bool allowTemp)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  FunctionBody *pFVar4;
  undefined4 *puVar5;
  undefined4 extraout_var_00;
  Var *ppvVar6;
  int local_2c [2];
  int32 slotOffset;
  
  iVar3 = (*(this->super_DiagStackFrame)._vptr_DiagStackFrame[2])();
  pFVar4 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)CONCAT44(extraout_var,iVar3));
  if (pFVar4 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                                ,0x21e,"(GetFunction() != __null)","GetFunction() != NULL");
    if (!bVar2) goto LAB_008d4e60;
    *puVar5 = 0;
  }
  iVar3 = (*(this->super_DiagStackFrame)._vptr_DiagStackFrame[2])(this);
  pFVar4 = JavascriptFunction::GetFunctionBody
                     ((JavascriptFunction *)CONCAT44(extraout_var_00,iVar3));
  bVar2 = FunctionBody::GetSlotOffset(pFVar4,slotId,local_2c,allowTemp);
  if (bVar2) {
    if (this->m_localVarSlotsOffset == -1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                                  ,0x223,"(m_localVarSlotsOffset != InvalidOffset)",
                                  "m_localVarSlotsOffset != InvalidOffset");
      if (!bVar2) goto LAB_008d4e60;
      *puVar5 = 0;
    }
    ppvVar6 = (Var *)((long)(local_2c[0] + this->m_localVarSlotsOffset) + (long)this->m_stackAddr);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                                ,0x22a,"(false)","false");
    if (!bVar2) {
LAB_008d4e60:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    ppvVar6 = (Var *)0x0;
  }
  return ppvVar6;
}

Assistant:

Var * DiagNativeStackFrame::GetSlotOffsetLocation(RegSlot slotId, bool allowTemp)
    {
        Assert(GetFunction() != NULL);

        int32 slotOffset;
        if (GetFunction()->GetSlotOffset(slotId, &slotOffset, allowTemp))
        {
            Assert(m_localVarSlotsOffset != InvalidOffset);
            slotOffset = m_localVarSlotsOffset + slotOffset;

            // We will have the var offset only (which is always the Var size. With TypeSpecialization, below will change to accommodate double offset.
            return (Js::Var *)(((char *)m_stackAddr) + slotOffset);
        }

        Assert(false);
        return NULL;
    }